

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

int __thiscall QDateTimeEditPrivate::closestSection(QDateTimeEditPrivate *this,int pos,bool forward)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  SectionNode SVar7;
  char local_78 [24];
  char *local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)pos < *(long *)(*(long *)&this->field_0x428 + 0x10)) {
    iVar4 = (uint)forward * 2 + -2;
    goto LAB_003c10b8;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_58,this);
  if (*(long *)(*(long *)&this->field_0x428 + -8 + *(long *)&this->field_0x430 * 0x18) <
      local_58.size - pos) {
    updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,(QString *)&local_58);
    uVar2 = *(ulong *)&this->field_0x418;
    lVar3 = 8;
    uVar5 = 0;
    do {
      if (uVar2 <= uVar5) {
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_60 = "default";
        QMessageLogger::warning
                  (local_78,"QDateTimeEdit: Internal Error: closestSection returned NoSection");
        iVar4 = -1;
        goto LAB_003c10ae;
      }
      SVar7._8_8_ = *(undefined8 *)(*(long *)&this->field_0x410 + -8 + lVar3);
      SVar7._0_8_ = &this->super_QDateTimeParser;
      iVar4 = QDateTimeParser::sectionPos(SVar7);
      iVar1 = QDateTimeParser::sectionSize((int)&this->super_QDateTimeParser);
      if (pos < iVar1 + iVar4) {
        iVar4 = (int)uVar5 - (uint)(!forward && pos < iVar4);
        goto LAB_003c10ae;
      }
      uVar2 = *(ulong *)&this->field_0x418;
      bVar6 = uVar5 != uVar2 - 1;
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x10;
    } while (pos <= iVar4 || bVar6);
LAB_003c1094:
    iVar4 = (int)uVar5 + -1;
  }
  else {
    if (!forward) {
      uVar5 = (ulong)*(uint *)&this->field_0x418;
      goto LAB_003c1094;
    }
    iVar4 = -3;
  }
LAB_003c10ae:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_003c10b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QDateTimeEditPrivate::closestSection(int pos, bool forward) const
{
    Q_ASSERT(pos >= 0);
    if (pos < separators.first().size())
        return forward ? 0 : FirstSectionIndex;

    const QString text = displayText();
    if (text.size() - pos < separators.last().size() + 1)
        return forward ? LastSectionIndex : int(sectionNodes.size() - 1);

    updateCache(value, text);
    for (int i=0; i<sectionNodes.size(); ++i) {
        const int tmp = sectionPos(sectionNodes.at(i));
        if (pos < tmp + sectionSize(i)) {
            if (pos < tmp && !forward) {
                return i-1;
            }
            return i;
        } else if (i == sectionNodes.size() - 1 && pos > tmp) {
            return i;
        }
    }
    qWarning("QDateTimeEdit: Internal Error: closestSection returned NoSection");
    return NoSectionIndex;
}